

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger-inl.h
# Opt level: O0

void __thiscall spdlog::async_logger::flush_(async_logger *this)

{
  bool bVar1;
  undefined8 uVar2;
  shared_ptr<spdlog::details::thread_pool> pool_ptr;
  async_overflow_policy in_stack_00000134;
  async_logger_ptr *in_stack_00000138;
  thread_pool *in_stack_00000140;
  enable_shared_from_this<spdlog::async_logger> *in_stack_ffffffffffffff78;
  weak_ptr<spdlog::details::thread_pool> *in_stack_ffffffffffffff88;
  string *msg;
  spdlog_ex *in_stack_ffffffffffffff90;
  allocator<char> *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  __shared_ptr local_18 [24];
  
  std::weak_ptr<spdlog::details::thread_pool>::lock(in_stack_ffffffffffffff88);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_18);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x28);
    msg = (string *)&stack0xffffffffffffffa7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
              );
    spdlog_ex::spdlog_ex(in_stack_ffffffffffffff90,msg);
    __cxa_throw(uVar2,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
  }
  std::__shared_ptr_access<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x2562ba);
  std::enable_shared_from_this<spdlog::async_logger>::shared_from_this(in_stack_ffffffffffffff78);
  details::thread_pool::post_flush(in_stack_00000140,in_stack_00000138,in_stack_00000134);
  std::shared_ptr<spdlog::async_logger>::~shared_ptr((shared_ptr<spdlog::async_logger> *)0x2562fd);
  std::shared_ptr<spdlog::details::thread_pool>::~shared_ptr
            ((shared_ptr<spdlog::details::thread_pool> *)0x2563ee);
  return;
}

Assistant:

SPDLOG_INLINE void spdlog::async_logger::flush_()
{
    if (auto pool_ptr = thread_pool_.lock())
    {
        pool_ptr->post_flush(shared_from_this(), overflow_policy_);
    }
    else
    {
        SPDLOG_THROW(spdlog_ex("async flush: thread pool doesn't exist anymore"));
    }
}